

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void DoIt(void)

{
  ValidateFootprint vFP;
  ValidateFootprint local_3088;
  
  local_3088.super_Validate.lineno_ = 1;
  local_3088.super_Validate.warnings_ = false;
  local_3088.super_Validate.MIN_ID_ = 1;
  local_3088._vptr_ValidateFootprint = (_func_int **)&PTR_SetPreviousEventID_00105d58;
  local_3088.convertToBin_ = false;
  local_3088.validationCheck_ = true;
  builtin_strncpy(local_3088.eveIDName_,"Event",6);
  builtin_strncpy(local_3088.areaperilIDName_,"Areaperil",10);
  local_3088.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3088.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3088.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3088.maxIntensityBin_ = 0;
  builtin_strncpy(local_3088.super_Validate.fileDescription_,"Footprint",10);
  Validate::SkipHeaderRow(&local_3088.super_Validate);
  ValidateFootprint::ReadFootprintFile(&local_3088);
  ValidateFootprint::PrintMaximumIntensityBinIndex(&local_3088);
  Validate::PrintSuccessMessage(&local_3088.super_Validate);
  local_3088._vptr_ValidateFootprint = (_func_int **)&PTR_SetPreviousEventID_00105d58;
  if (local_3088.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3088.intensityBinIDs_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DoIt() {

  ValidateFootprint vFP;
  vFP.SkipHeaderRow();
  vFP.ReadFootprintFile();
  vFP.PrintMaximumIntensityBinIndex();
  vFP.PrintSuccessMessage();

}